

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_4d0a32::cURLProgressHelper::UpdatePercentage
          (cURLProgressHelper *this,double value,double total,string *status)

{
  int iVar1;
  ostream *poVar2;
  bool bVar3;
  string local_1d8 [48];
  ostringstream local_1a8 [8];
  ostringstream oss;
  bool updated;
  int OldPercentage;
  string *status_local;
  double total_local;
  double value_local;
  cURLProgressHelper *this_local;
  
  iVar1 = this->CurrentPercentage;
  if ((0.0 < total) &&
     (this->CurrentPercentage = (int)((value / total) * 100.0 + 0.5), 100 < this->CurrentPercentage)
     ) {
    this->CurrentPercentage = 100;
  }
  bVar3 = iVar1 != this->CurrentPercentage;
  if (bVar3) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = std::operator<<((ostream *)local_1a8,"[");
    poVar2 = std::operator<<(poVar2,(string *)&this->Text);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->CurrentPercentage);
    std::operator<<(poVar2,"% complete]");
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)status,local_1d8);
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  return bVar3;
}

Assistant:

bool UpdatePercentage(double value, double total, std::string &status)
      {
      int OldPercentage = this->CurrentPercentage;

      if (total > 0.0)
        {
        this->CurrentPercentage = static_cast<int>(value/total*100.0 + 0.5);
        if(this->CurrentPercentage > 100)
          {
          // Avoid extra progress reports for unexpected data beyond total.
          this->CurrentPercentage = 100;
          }
        }

      bool updated = (OldPercentage != this->CurrentPercentage);

      if (updated)
        {
        std::ostringstream oss;
        oss << "[" << this->Text << " " << this->CurrentPercentage
            << "% complete]";
        status = oss.str();
        }

      return updated;
      }